

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

bool __thiscall cmMakefile::IsDefinitionSet(cmMakefile *this,string *name)

{
  cmake *pcVar1;
  cmVariableWatch *this_00;
  char *pcVar2;
  bool bVar3;
  StackIter local_28;
  StackIter local_20;
  
  local_20.current._M_node = (_List_iterator<cmDefinitions>)(this->Internal).x_;
  local_28.current._M_node =
       (_List_iterator<cmDefinitions>)
       (((list<cmDefinitions,_std::allocator<cmDefinitions>_> *)
        &((_List_node_base *)local_20.current._M_node)->_M_next)->
       super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>)._M_impl._M_node.
       super__List_node_base._M_next;
  pcVar2 = cmDefinitions::Get(name,&local_20,&local_28);
  bVar3 = true;
  if (pcVar2 == (char *)0x0) {
    pcVar2 = cmState::GetInitializedCacheValue
                       (this->LocalGenerator->GlobalGenerator->CMakeInstance->State,name);
    bVar3 = pcVar2 != (char *)0x0;
  }
  pcVar1 = this->LocalGenerator->GlobalGenerator->CMakeInstance;
  if ((pcVar1 != (cmake *)0x0) &&
     (this_00 = pcVar1->VariableWatch, this_00 != (cmVariableWatch *)0x0 && bVar3 == false)) {
    cmVariableWatch::VariableAccessed(this_00,name,2,(char *)0x0,this);
  }
  return bVar3;
}

Assistant:

bool cmMakefile::IsDefinitionSet(const std::string& name) const
{
  const char* def = this->Internal->GetDefinition(name);
  if(!def)
    {
    def = this->GetState()->GetInitializedCacheValue(name);
    }
#ifdef CMAKE_BUILD_WITH_CMAKE
  if(cmVariableWatch* vv = this->GetVariableWatch())
    {
    if(!def)
      {
      vv->VariableAccessed
        (name, cmVariableWatch::UNKNOWN_VARIABLE_DEFINED_ACCESS,
         def, this);
      }
    }
#endif
  return def?true:false;
}